

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

bool flatbuffers::GenerateTSGRPC(Parser *parser,string *path,string *file_name)

{
  pointer ppSVar1;
  bool bVar2;
  pointer ppSVar3;
  int iVar4;
  undefined1 local_270 [568];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  ppSVar3 = (parser->services_).vec.
            super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (parser->services_).vec.
            super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  if (ppSVar3 != ppSVar1) {
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (((*ppSVar3)->super_Definition).generated ^ 1);
      ppSVar3 = ppSVar3 + 1;
    } while (ppSVar3 != ppSVar1);
    if (iVar4 != 0) {
      TSGRPCGenerator::TSGRPCGenerator((TSGRPCGenerator *)local_270,parser,path,file_name);
      bVar2 = TSGRPCGenerator::generate((TSGRPCGenerator *)local_270);
      local_270._0_8_ = &PTR_generate_003f4460;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_p != &local_28) {
        operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_270 + 0xb0));
      std::ios_base::~ios_base((ios_base *)(local_270 + 0x130));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_270 + 0x80));
      BaseGenerator::~BaseGenerator((BaseGenerator *)local_270);
    }
  }
  return bVar2;
}

Assistant:

bool GenerateTSGRPC(const Parser &parser, const std::string &path,
                    const std::string &file_name) {
  int nservices = 0;
  for (auto it = parser.services_.vec.begin(); it != parser.services_.vec.end();
       ++it) {
    if (!(*it)->generated) nservices++;
  }
  if (!nservices) return true;
  return TSGRPCGenerator(parser, path, file_name).generate();
}